

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O1

void more(void)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  if (skip_more != '\0') {
    return;
  }
  draw_msgwin();
  bVar8 = settings.standout != '\0';
  if ((msgwin == (WINDOW *)0x0) || (uVar5 = (uint)(ushort)msgwin->_maxy, msgwin->_maxy != 0)) {
    if (msglines[curline][0] != '\0') {
      wVar2 = curline + L'\x01';
      bVar1 = curline < L'\'';
      curline = L'\0';
      if (bVar1) {
        curline = wVar2;
      }
      msglines[curline][0] = '\0';
    }
    draw_msgwin();
    uVar5 = 0xfffffffe;
    iVar7 = -2;
    if (msgwin != (WINDOW *)0x0) {
      iVar7 = (int)msgwin->_maxy;
    }
    wmove(msgwin,iVar7,0);
    wclrtoeol(msgwin);
    if (msgwin != (WINDOW *)0x0) {
      uVar5 = (uint)msgwin->_maxy;
    }
    uVar4 = 0x24;
  }
  else {
    uVar4 = 0x48;
  }
  wmove(msgwin,uVar5,uVar4);
  wattr_on(msgwin,(ulong)bVar8 << 0x10,0);
  iVar6 = -1;
  waddnstr(msgwin,"--More--",0xffffffff);
  wattr_off(msgwin,(ulong)bVar8 << 0x10,0);
  wrefresh(msgwin);
  iVar7 = -1;
  if (msgwin != (WINDOW *)0x0) {
    iVar7 = (int)msgwin->_cury;
    iVar6 = (int)msgwin->_curx;
  }
  do {
    do {
      wVar2 = nh_wgetch(msgwin);
      draw_map(player.x,player.y);
      wmove(msgwin,iVar7,iVar6);
      doupdate();
    } while (0x20 < (uint)wVar2);
  } while ((0x108002400U >> ((ulong)(uint)wVar2 & 0x3f) & 1) == 0);
  iVar7 = -2;
  if (msgwin != (WINDOW *)0x0) {
    if (msgwin->_maxy == 0) {
      if (msglines[curline][0] != '\0') {
        wVar3 = curline + L'\x01';
        bVar8 = curline < L'\'';
        curline = L'\0';
        if (bVar8) {
          curline = wVar3;
        }
        msglines[curline][0] = '\0';
      }
      goto LAB_0010edaf;
    }
    if (msgwin != (WINDOW *)0x0) {
      iVar7 = (int)msgwin->_maxy;
    }
  }
  wmove(msgwin,iVar7,0);
  wclrtoeol(msgwin);
LAB_0010edaf:
  draw_msgwin();
  if (wVar2 == L'\x1b') {
    skip_more = '\x01';
  }
  last_redraw_curline = curline;
  return;
}

Assistant:

static void more(void)
{
    int key;
    int cursx, cursy;
    attr_t attr = A_NORMAL;

    if (skip_more)
	return;

    draw_msgwin();

    if (settings.standout)
	attr = A_STANDOUT;

    if (getmaxy(msgwin) == 1) {
	wmove(msgwin, getmaxy(msgwin)-1, COLNO-8);
	wattron(msgwin, attr);
	waddstr(msgwin, "--More--");
	wattroff(msgwin, attr);
	wrefresh(msgwin);
    } else {
	newline();
	draw_msgwin();
	wmove(msgwin, getmaxy(msgwin)-1, 0);
	wclrtoeol(msgwin);
	wmove(msgwin, getmaxy(msgwin)-1, COLNO/2 - 4);
	wattron(msgwin, attr);
	waddstr(msgwin, "--More--");
	wattroff(msgwin, attr);
	wrefresh(msgwin);
    }

    getyx(msgwin, cursy, cursx);
    do {
	key = nh_wgetch(msgwin);
	draw_map(player.x, player.y);
	wmove(msgwin, cursy, cursx);
	doupdate();
    } while (key != '\n' && key != '\r' && key != ' ' && key != KEY_ESC);

    /* Clean up after the --More--. */
    if (getmaxy(msgwin) == 1) {
	newline();
    } else {
	wmove(msgwin, getmaxy(msgwin)-1, 0);
	wclrtoeol(msgwin);
    }
    draw_msgwin();

    if (key == KEY_ESC)
	skip_more = TRUE;

    /* we want to --more-- by screenfuls, not lines */
    last_redraw_curline = curline;
}